

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O0

QVariant * __thiscall QMimeData::colorData(QMimeData *this)

{
  long lVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QMimeDataPrivate *d;
  QString *in_stack_00000120;
  QMimeDataPrivate *in_stack_00000128;
  QMetaType in_stack_00000428;
  int in_stack_ffffffffffffff8c;
  QMetaType *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMimeData *)0x3e6927);
  applicationXColorLiteral();
  QMetaType::QMetaType(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QMimeDataPrivate::retrieveTypedData(in_stack_00000128,in_stack_00000120,in_stack_00000428);
  QString::~QString((QString *)0x3e6976);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QMimeData::colorData() const
{
    Q_D(const QMimeData);
    return d->retrieveTypedData(applicationXColorLiteral(), QMetaType(QMetaType::QColor));
}